

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds03_heap_order.cpp
# Opt level: O1

void __thiscall
CP::priority_queue<student,_std::less<student>_>::pop
          (priority_queue<student,_std::less<student>_> *this)

{
  size_t sVar1;
  student *psVar2;
  out_of_range *this_00;
  
  sVar1 = this->mSize;
  if (sVar1 != 0) {
    psVar2 = this->mData;
    std::__cxx11::string::_M_assign((string *)psVar2);
    psVar2->score = psVar2[sVar1 - 1].score;
    this->mSize = this->mSize - 1;
    fixDown(this,0);
    return;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"index of out range");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

size_t size() const {
      return mSize;
    }